

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembler.cpp
# Opt level: O0

void __thiscall Assembler::printCodeBySection(Assembler *this)

{
  bool bVar1;
  _Setfill<char> _Var2;
  _Setw _Var3;
  ostream *poVar4;
  reference ppVar5;
  byte *pbVar6;
  char *byte;
  iterator __end2;
  iterator __begin2;
  vector<char,_std::allocator<char>_> *__range2;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>_>
  *oneSection;
  iterator __end1;
  iterator __begin1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>_>_>_>
  *__range1;
  ostream local_210 [8];
  ofstream file;
  Assembler *this_local;
  
  std::ofstream::ofstream(local_210,(string *)&this->outputFileName,_S_app);
  poVar4 = std::operator<<(local_210,"Code:");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  __end1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>_>_>_>
           ::begin(&this->codeBySection);
  oneSection = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>_>
                *)std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>_>_>_>
                  ::end(&this->codeBySection);
  while (bVar1 = std::operator!=(&__end1,(_Self *)&oneSection), bVar1) {
    ppVar5 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>_>_>
             ::operator*(&__end1);
    bVar1 = std::vector<char,_std::allocator<char>_>::empty(&ppVar5->second);
    if (!bVar1) {
      poVar4 = std::operator<<(local_210,"section name: ");
      poVar4 = std::operator<<(poVar4,(string *)ppVar5);
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      __end2 = std::vector<char,_std::allocator<char>_>::begin(&ppVar5->second);
      byte = (char *)std::vector<char,_std::allocator<char>_>::end(&ppVar5->second);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end2,(__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>
                                         *)&byte), bVar1) {
        pbVar6 = (byte *)__gnu_cxx::
                         __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::
                         operator*(&__end2);
        poVar4 = (ostream *)std::ostream::operator<<(local_210,std::hex);
        _Var3 = std::setw(2);
        poVar4 = std::operator<<(poVar4,_Var3);
        _Var2 = std::setfill<char>('0');
        poVar4 = std::operator<<(poVar4,_Var2._M_c);
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,(uint)*pbVar6);
        std::operator<<(poVar4,"\t");
        __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::operator++
                  (&__end2);
      }
      poVar4 = (ostream *)std::ostream::operator<<(local_210,std::dec);
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    }
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>_>_>
    ::operator++(&__end1);
  }
  std::ofstream::~ofstream(local_210);
  return;
}

Assistant:

void Assembler::printCodeBySection() {
    ofstream file(this->outputFileName, ios::app);

    file << "Code:" << endl << endl;

    for (auto &oneSection: codeBySection) {
        if (oneSection.second.empty()) continue;
        file << "section name: " << oneSection.first << endl << endl;

        for (const auto &byte: oneSection.second) {

            file << hex << setw(2) << setfill('0') << (((int) byte) & 0xFF) << "\t";


        }
        file << dec << endl << endl;

    }
}